

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

int mbedtls_blowfish_crypt_cbc
              (mbedtls_blowfish_context *ctx,int mode,size_t length,uchar *iv,uchar *input,
              uchar *output)

{
  undefined8 uVar1;
  uchar temp [8];
  int i;
  uchar *output_local;
  uchar *input_local;
  uchar *iv_local;
  size_t length_local;
  int mode_local;
  mbedtls_blowfish_context *ctx_local;
  
  if ((length & 7) == 0) {
    unique0x1000006a = output;
    output_local = input;
    iv_local = (uchar *)length;
    if (mode == 0) {
      for (; iv_local != (uchar *)0x0; iv_local = iv_local + -8) {
        uVar1 = *(undefined8 *)output_local;
        mbedtls_blowfish_crypt_ecb(ctx,0,output_local,stack0xffffffffffffffc0);
        temp[0] = '\0';
        temp[1] = '\0';
        temp[2] = '\0';
        temp[3] = '\0';
        for (; (int)temp._0_4_ < 8; temp._0_4_ = temp._0_4_ + 1) {
          stack0xffffffffffffffc0[(int)temp._0_4_] =
               stack0xffffffffffffffc0[(int)temp._0_4_] ^ iv[(int)temp._0_4_];
        }
        *(undefined8 *)iv = uVar1;
        output_local = output_local + 8;
        register0x00000000 = stack0xffffffffffffffc0 + 8;
      }
    }
    else {
      for (; iv_local != (uchar *)0x0; iv_local = iv_local + -8) {
        temp[0] = '\0';
        temp[1] = '\0';
        temp[2] = '\0';
        temp[3] = '\0';
        for (; (int)temp._0_4_ < 8; temp._0_4_ = temp._0_4_ + 1) {
          stack0xffffffffffffffc0[(int)temp._0_4_] =
               output_local[(int)temp._0_4_] ^ iv[(int)temp._0_4_];
        }
        mbedtls_blowfish_crypt_ecb(ctx,mode,stack0xffffffffffffffc0,stack0xffffffffffffffc0);
        *(undefined8 *)iv = *(undefined8 *)stack0xffffffffffffffc0;
        output_local = output_local + 8;
        register0x00000000 = stack0xffffffffffffffc0 + 8;
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -0x18;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_blowfish_crypt_cbc( mbedtls_blowfish_context *ctx,
                    int mode,
                    size_t length,
                    unsigned char iv[MBEDTLS_BLOWFISH_BLOCKSIZE],
                    const unsigned char *input,
                    unsigned char *output )
{
    int i;
    unsigned char temp[MBEDTLS_BLOWFISH_BLOCKSIZE];
    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( mode == MBEDTLS_BLOWFISH_ENCRYPT ||
                           mode == MBEDTLS_BLOWFISH_DECRYPT );
    BLOWFISH_VALIDATE_RET( iv != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || input  != NULL );
    BLOWFISH_VALIDATE_RET( length == 0 || output != NULL );

    if( length % MBEDTLS_BLOWFISH_BLOCKSIZE )
        return( MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH );

    if( mode == MBEDTLS_BLOWFISH_DECRYPT )
    {
        while( length > 0 )
        {
            memcpy( temp, input, MBEDTLS_BLOWFISH_BLOCKSIZE );
            mbedtls_blowfish_crypt_ecb( ctx, mode, input, output );

            for( i = 0; i < MBEDTLS_BLOWFISH_BLOCKSIZE;i++ )
                output[i] = (unsigned char)( output[i] ^ iv[i] );

            memcpy( iv, temp, MBEDTLS_BLOWFISH_BLOCKSIZE );

            input  += MBEDTLS_BLOWFISH_BLOCKSIZE;
            output += MBEDTLS_BLOWFISH_BLOCKSIZE;
            length -= MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }
    else
    {
        while( length > 0 )
        {
            for( i = 0; i < MBEDTLS_BLOWFISH_BLOCKSIZE; i++ )
                output[i] = (unsigned char)( input[i] ^ iv[i] );

            mbedtls_blowfish_crypt_ecb( ctx, mode, output, output );
            memcpy( iv, output, MBEDTLS_BLOWFISH_BLOCKSIZE );

            input  += MBEDTLS_BLOWFISH_BLOCKSIZE;
            output += MBEDTLS_BLOWFISH_BLOCKSIZE;
            length -= MBEDTLS_BLOWFISH_BLOCKSIZE;
        }
    }

    return( 0 );
}